

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

double __thiscall
ON_PlaneEquation::MaximumAbsoluteValueAt
          (ON_PlaneEquation *this,bool bRational,int point_count,int point_stride,double *points,
          double stop_value)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = -1.23432101234321e+308;
  if ((0 < point_count) && (points != (double *)0x0 && (int)(bRational + 3) <= point_stride)) {
    if (1.23432101234321e+308 <= ABS(stop_value)) {
      if (bRational) {
        dVar5 = points[3];
        dVar6 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                        (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
        iVar3 = point_count + -1;
        pdVar2 = points + (ulong)(uint)point_stride + 3;
        dVar5 = ABS(dVar6 * this->z * points[2] +
                    this->x * dVar6 * *points + dVar6 * this->y * points[1] + dVar5);
        while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
          dVar6 = *pdVar2;
          dVar1 = (double)(~-(ulong)(dVar6 != 0.0) & 0x3ff0000000000000 |
                          (ulong)(1.0 / dVar6) & -(ulong)(dVar6 != 0.0));
          dVar6 = ABS(dVar1 * this->z * pdVar2[-1] +
                      this->x * dVar1 * pdVar2[-3] + this->y * dVar1 * pdVar2[-2] + dVar6);
          if (dVar6 <= dVar5) {
            dVar6 = dVar5;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          dVar5 = dVar6;
        }
      }
      else {
        iVar3 = point_count + -1;
        pdVar2 = points + (ulong)(uint)point_stride + 2;
        dVar5 = ABS(points[2] * this->z + *points * this->x + points[1] * this->y + this->d);
        while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
          dVar6 = ABS(*pdVar2 * this->z + pdVar2[-2] * this->x + pdVar2[-1] * this->y + this->d);
          if (dVar6 <= dVar5) {
            dVar6 = dVar5;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          dVar5 = dVar6;
        }
      }
    }
    else if (bRational) {
      dVar5 = points[3];
      dVar6 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                      (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
      dVar6 = ABS(dVar6 * this->z * points[2] +
                  this->x * dVar6 * *points + dVar6 * this->y * points[1] + dVar5);
      if (stop_value < dVar6) {
        return dVar6;
      }
      do {
        point_count = point_count + -1;
        if (point_count == 0) {
          return dVar6;
        }
        pdVar2 = points + (uint)point_stride;
        dVar5 = points[(ulong)(uint)point_stride + 3];
        dVar1 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                        (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
        dVar5 = ABS(dVar1 * this->z * points[(ulong)(uint)point_stride + 2] +
                    this->x * dVar1 * points[(uint)point_stride] +
                    this->y * dVar1 * points[(ulong)(uint)point_stride + 1] + dVar5);
        points = pdVar2;
      } while ((dVar5 <= dVar6) || (dVar6 = dVar5, dVar5 <= stop_value));
    }
    else {
      dVar6 = ABS(points[2] * this->z + *points * this->x + points[1] * this->y + this->d);
      if (stop_value < dVar6) {
        return dVar6;
      }
      do {
        point_count = point_count + -1;
        if (point_count == 0) {
          return dVar6;
        }
        pdVar2 = points + (uint)point_stride;
        dVar5 = ABS(points[(ulong)(uint)point_stride + 2] * this->z +
                    points[(uint)point_stride] * this->x +
                    points[(ulong)(uint)point_stride + 1] * this->y + this->d);
        points = pdVar2;
      } while ((dVar5 <= dVar6) || (dVar6 = dVar5, dVar5 <= stop_value));
    }
  }
  return dVar5;
}

Assistant:

double ON_PlaneEquation::MaximumAbsoluteValueAt(
  bool bRational,
  int point_count,
  int point_stride,
  const double* points,
  double stop_value
  ) const
{
  double value, max_value, w;

  if (    point_count < 1 
       || point_stride < (bRational?4:3) 
       || 0 == points
       )
  {
    return ON_UNSET_VALUE;
  }

  if ( ON_IsValid(stop_value) )
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      max_value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
      if ( max_value > stop_value )
        return max_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
        if ( value > max_value )
        {
          if ( (max_value = value) > stop_value )
            return max_value;
        }
      }
    }
    else
    {
      max_value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
      if ( max_value > stop_value )
        return max_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
        if ( value > max_value )
        {
          if ( (max_value = value) > stop_value )
            return max_value;
        }
      }
    }
  }
  else
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      max_value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
        if ( value > max_value )
          max_value = value;
      }
    }
    else
    {
      max_value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
        if ( value > max_value )
          max_value = value;
      }
    }
  }

  return max_value;
}